

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

exr_result_t
reconstruct_chunk_table(_internal_exr_context *ctxt,_internal_exr_part *part,uint64_t *chunktable)

{
  _internal_exr_part **pp_Var1;
  _internal_exr_part *part_00;
  long lVar2;
  exr_result_t eVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int partnum;
  long lVar9;
  long lVar10;
  ulong offset;
  ulong uVar11;
  uint64_t offset_start;
  uint64_t *curctable;
  priv_chunk_leader leader;
  ulong local_a0;
  uint local_94;
  uint64_t local_90;
  _internal_exr_context *local_88;
  uint64_t *local_80;
  ulong local_78;
  ulong *local_70;
  priv_chunk_leader local_68;
  
  pp_Var1 = ctxt->parts;
  local_a0 = pp_Var1[(long)ctxt->num_parts + -1]->chunk_table_offset +
             (long)pp_Var1[(long)ctxt->num_parts + -1]->chunk_count * 8;
  if (*pp_Var1 == part) {
    lVar10 = 0;
  }
  else {
    lVar9 = 0;
    do {
      lVar10 = lVar9 + 1;
      lVar2 = lVar9 + 1;
      lVar9 = lVar10;
    } while (pp_Var1[lVar2] != part);
  }
  local_78 = 0xffffffffffffffff;
  if (0 < ctxt->file_size) {
    local_78 = ctxt->file_size;
  }
  partnum = (int)lVar10;
  if (partnum != 0) {
    part_00 = pp_Var1[partnum - 1U];
    eVar3 = extract_chunk_table(ctxt,part_00,&local_70,&local_90);
    if (eVar3 != 0) {
      return eVar3;
    }
    local_90 = *local_70;
    if (1 < (long)part_00->chunk_count) {
      lVar10 = 1;
      do {
        if (local_90 < local_70[lVar10]) {
          local_90 = local_70[lVar10];
        }
        lVar10 = lVar10 + 1;
      } while (part_00->chunk_count != lVar10);
    }
    eVar3 = extract_chunk_leader(ctxt,part_00,partnum - 1U,local_90,&local_a0,&local_68);
    if (eVar3 != 0) {
      return eVar3;
    }
  }
  uVar7 = (ulong)(uint)part->chunk_count;
  if (0 < part->chunk_count) {
    iVar8 = -1;
    uVar11 = 0;
    local_88 = ctxt;
    local_80 = chunktable;
    do {
      uVar5 = local_80[uVar11];
      offset = local_a0;
      if (uVar5 < local_78) {
        offset = uVar5;
      }
      if (uVar5 < local_a0) {
        offset = local_a0;
      }
      uVar7 = (ulong)(uint)((int)uVar7 + iVar8);
      if (part->lineorder != EXR_LINEORDER_DECREASING_Y) {
        uVar7 = uVar11 & 0xffffffff;
      }
      local_a0 = offset;
      iVar4 = extract_chunk_leader(local_88,part,partnum,offset,&local_a0,&local_68);
      iVar6 = (int)uVar7;
      if (iVar4 == 0) {
        if ((part->storage_mode & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_SCANLINE) {
          uVar5 = ((long)local_68.field_1.scanline_y -
                  (long)(part->data_window).min.field_0.field_0.y) / (long)part->lines_per_chunk;
          if ((uVar5 & 0xffffffff80000000) == 0) {
            iVar4 = 0;
            uVar7 = uVar5;
          }
          else {
            iVar4 = (*local_88->print_error)
                              (local_88,0x16,
                               "Invalid chunk index: %ld reading scanline %d (datawindow min %d) with lines per chunk %d"
                              );
          }
        }
        else {
          local_94 = 0;
          iVar4 = validate_and_compute_tile_chunk_off
                            (local_88,part,local_68.field_1.scanline_y,
                             local_68.field_1.field_1.tile_y,local_68.field_1.field_1.level_x,
                             local_68.field_1.field_1.level_y,(int32_t *)&local_94);
          uVar7 = (ulong)local_94;
        }
      }
      if (iVar4 != 0) {
        return iVar4;
      }
      if (((part->storage_mode & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_SCANLINE) &&
         (iVar6 != (int)uVar7)) {
        return 0x16;
      }
      local_80[(int)uVar7] = offset;
      uVar11 = uVar11 + 1;
      uVar7 = (ulong)part->chunk_count;
      iVar8 = iVar8 + -1;
    } while ((long)uVar11 < (long)uVar7);
  }
  return 0;
}

Assistant:

static exr_result_t
reconstruct_chunk_table (
    const struct _internal_exr_context* ctxt,
    const struct _internal_exr_part*    part,
    uint64_t*                           chunktable)
{
    exr_result_t                     rv = EXR_ERR_SUCCESS;
    uint64_t                         offset_start, chunk_start, max_offset;
    uint64_t*                        curctable;
    const struct _internal_exr_part* curpart = NULL;
    int                              found_ci, computed_ci, partnum = 0;

    curpart      = ctxt->parts[ctxt->num_parts - 1];
    offset_start = curpart->chunk_table_offset;
    offset_start += sizeof (uint64_t) * (uint64_t) curpart->chunk_count;

    curpart = ctxt->parts[partnum];
    while (curpart != part)
    {
        ++partnum;
        curpart = ctxt->parts[partnum];
    }

    max_offset = (uint64_t) -1;
    if (ctxt->file_size > 0) max_offset = (uint64_t) ctxt->file_size;

    // for multi-part, need to start at the first part and extract everything, then
    // work our way back up to this one, then grab the end of the previous part
    if (partnum > 0)
    {
        curpart = ctxt->parts[partnum - 1];
        rv      = extract_chunk_table (ctxt, curpart, &curctable, &chunk_start);
        if (rv != EXR_ERR_SUCCESS) return rv;

        chunk_start = curctable[0];
        for (int ci = 1; ci < curpart->chunk_count; ++ci)
        {
            if (curctable[ci] > chunk_start)
            {
                chunk_start = curctable[ci];
            }
        }

        rv = extract_chunk_size (
            ctxt, curpart, partnum - 1, chunk_start, &offset_start);
        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    for (int ci = 0; ci < part->chunk_count; ++ci)
    {
        if (chunktable[ci] >= offset_start && chunktable[ci] < max_offset)
        {
            offset_start = chunktable[ci];
        }
        chunk_start = offset_start;
        computed_ci = ci;
        if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
            computed_ci = part->chunk_count - (ci + 1);
        found_ci = computed_ci;
        rv       = read_and_validate_chunk_leader (
            ctxt, part, partnum, chunk_start, &found_ci, &offset_start);
        if (rv != EXR_ERR_SUCCESS) return rv;

        // scanlines can be more strict about the ordering
        if (part->storage_mode == EXR_STORAGE_SCANLINE ||
            part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
        {
            if (computed_ci != found_ci) return EXR_ERR_BAD_CHUNK_LEADER;
        }

        chunktable[found_ci] = chunk_start;
    }

    return rv;
}